

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O0

void test_bitblt(void)

{
  Am_Drawonable *pAVar1;
  void *pvVar2;
  undefined4 uVar3;
  char *s;
  Am_Style local_10 [8];
  
  uVar3 = 0;
  (**(code **)(*(long *)db + 0x90))(db,0);
  (**(code **)(*(long *)db + 0x58))(db,300);
  (**(code **)(*(long *)db + 0x58))(db,0x4b,0xbe);
  (**(code **)(*(long *)db + 0x160))(db,&red,&Am_No_Style,0,0,0x4b,0xbe,0,uVar3);
  (**(code **)(*(long *)db + 0x50))(db,0x14a,300);
  (**(code **)(*(long *)db + 0x70))(db,1);
  pAVar1 = db;
  Am_Style::Am_Style(local_10,(Am_Style *)&red);
  (**(code **)(*(long *)pAVar1 + 0x80))(pAVar1,local_10);
  Am_Style::~Am_Style(local_10);
  (**(code **)(*(long *)db + 0x140))(db,&black,0,0,0x4b,0xbe,0);
  (**(code **)(*(long *)db + 0x140))(db,&black,0x4b,0,0,0xbe,0);
  (**(code **)(*(long *)db + 0x178))(db,"Hit RETURN to hide:");
  pvVar2 = (void *)(**(code **)(*(long *)db + 0x180))();
  if (pvVar2 != (void *)0x0) {
    operator_delete__(pvVar2);
  }
  (**(code **)(*(long *)db + 0x70))(db,0);
  (**(code **)(*(long *)d5 + 0x90))(d5,0xb4,0x118,0x4b,0xbe,db,0,0,0);
  (**(code **)(*(long *)db + 8))();
  (**(code **)(*(long *)d5 + 0xa0))();
  return;
}

Assistant:

void
test_bitblt()
{
  //#if !defined(_WINDOWS)
  //  d5->Bitblt(180, 280, 75, 190, d1, 75, 60);
  //  d5->Flush_Output ();
  //#else

  db->Bitblt(0, 0, 75, 190, d1, 75, 60);               // bitblt in invisible
  db->Set_Size(300, 300);                              // resizing invisible
  db->Set_Size(75, 190);                               // (preserves contents)
  db->Draw_Rectangle(red, Am_No_Style, 0, 0, 75, 190); // drawing in invisible
  db->Set_Position(330, 300);
  db->Set_Visible(true); // showing invisible
  db->Set_Background_Color(red);
  db->Draw_Line(black, 0, 0, 75, 190); // drawing in visible
  db->Draw_Line(black, 75, 0, 0, 190);
  // setting/getting cut buffer shouldn't crash, but should do nothing.
  db->Set_Cut_Buffer("Hit RETURN to hide:"); // test clipping
  char *s = db->Get_Cut_Buffer();
  delete[] s;             // we are responsible for deleting 's'
  db->Set_Visible(false); // hiding again (preserves contents)
  d5->Bitblt(180, 280, 75, 190, db, 0, 0); // bitblt from invisible
  db->Destroy();
  d5->Flush_Output();
  //#endif
}